

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

void __thiscall
tcu::TestSessionExecutor::leaveTestCase(TestSessionExecutor *this,TestCase *testCase)

{
  bool bVar1;
  TestCaseExecutor *pTVar2;
  deUint64 dVar3;
  TestLog *pTVar4;
  char *description;
  char *pcVar5;
  qpWatchDog *pqVar6;
  bool terminateAfter;
  char *testResultDesc;
  qpTestResult testResult;
  allocator<char> local_279;
  string local_278;
  allocator<char> local_251;
  string local_250;
  LogNumber<long> local_230;
  long local_1c0;
  deInt64 duration;
  Exception *e;
  TestLog *local_20;
  TestLog *log;
  TestCase *testCase_local;
  TestSessionExecutor *this_local;
  
  log = (TestLog *)testCase;
  testCase_local = (TestCase *)this;
  local_20 = TestContext::getLog(this->m_testCtx);
  pTVar2 = de::details::
           UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::operator->
                     (&(this->m_caseExecutor).
                       super_UniqueBase<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>
                     );
  (*pTVar2->_vptr_TestCaseExecutor[3])(pTVar2,log);
  dVar3 = deGetMicroseconds();
  local_1c0 = dVar3 - this->m_testStartTime;
  this->m_testStartTime = 0;
  pTVar4 = TestContext::getLog(this->m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"TestDuration",&local_251)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"Test case duration in microseconds",&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&testResult,"us",(allocator<char> *)((long)&testResultDesc + 7));
  LogNumber<long>::LogNumber
            (&local_230,&local_250,&local_278,(string *)&testResult,QP_KEY_TAG_TIME,local_1c0);
  TestLog::operator<<(pTVar4,&local_230);
  LogNumber<long>::~LogNumber(&local_230);
  std::__cxx11::string::~string((string *)&testResult);
  std::allocator<char>::~allocator((allocator<char> *)((long)&testResultDesc + 7));
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  testResultDesc._0_4_ = TestContext::getTestResult(this->m_testCtx);
  description = TestContext::getTestResultDesc(this->m_testCtx);
  bVar1 = TestContext::getTerminateAfter(this->m_testCtx);
  this->m_isInTestCase = false;
  pTVar4 = TestContext::getLog(this->m_testCtx);
  TestLog::endCase(pTVar4,(qpTestResult)testResultDesc,description);
  pcVar5 = qpGetTestResultName((qpTestResult)testResultDesc);
  tcu::print("  %s (%s)\n",pcVar5,description);
  (this->m_status).numExecuted = (this->m_status).numExecuted + 1;
  switch((qpTestResult)testResultDesc) {
  case QP_TEST_RESULT_PASS:
    (this->m_status).numPassed = (this->m_status).numPassed + 1;
    break;
  default:
    (this->m_status).numFailed = (this->m_status).numFailed + 1;
    break;
  case QP_TEST_RESULT_QUALITY_WARNING:
    (this->m_status).numWarnings = (this->m_status).numWarnings + 1;
    break;
  case QP_TEST_RESULT_COMPATIBILITY_WARNING:
    (this->m_status).numWarnings = (this->m_status).numWarnings + 1;
    break;
  case QP_TEST_RESULT_NOT_SUPPORTED:
    (this->m_status).numNotSupported = (this->m_status).numNotSupported + 1;
  }
  if ((bVar1) || ((qpTestResult)testResultDesc == QP_TEST_RESULT_RESOURCE_ERROR)) {
    this->m_abortSession = true;
  }
  pqVar6 = TestContext::getWatchDog(this->m_testCtx);
  if (pqVar6 != (qpWatchDog *)0x0) {
    pqVar6 = TestContext::getWatchDog(this->m_testCtx);
    qpWatchDog_reset(pqVar6);
  }
  return;
}

Assistant:

void TestSessionExecutor::leaveTestCase (TestCase* testCase)
{
	TestLog&	log		= m_testCtx.getLog();

	// De-init case.
	try
	{
		m_caseExecutor->deinit(testCase);
	}
	catch (const tcu::Exception& e)
	{
		log << e << TestLog::Message << "Error in test case deinit, test program will terminate." << TestLog::EndMessage;
		m_testCtx.setTerminateAfter(true);
	}

	{
		const deInt64 duration = deGetMicroseconds()-m_testStartTime;
		m_testStartTime = 0;
		m_testCtx.getLog() << TestLog::Integer("TestDuration", "Test case duration in microseconds", "us", QP_KEY_TAG_TIME, duration);
	}

	{
		const qpTestResult	testResult		= m_testCtx.getTestResult();
		const char* const	testResultDesc	= m_testCtx.getTestResultDesc();
		const bool			terminateAfter	= m_testCtx.getTerminateAfter();
		DE_ASSERT(testResult != QP_TEST_RESULT_LAST);

		m_isInTestCase = false;
		m_testCtx.getLog().endCase(testResult, testResultDesc);

		// Update statistics.
		print("  %s (%s)\n", qpGetTestResultName(testResult), testResultDesc);

		m_status.numExecuted += 1;
		switch (testResult)
		{
			case QP_TEST_RESULT_PASS:					m_status.numPassed			+= 1;	break;
			case QP_TEST_RESULT_NOT_SUPPORTED:			m_status.numNotSupported	+= 1;	break;
			case QP_TEST_RESULT_QUALITY_WARNING:		m_status.numWarnings		+= 1;	break;
			case QP_TEST_RESULT_COMPATIBILITY_WARNING:	m_status.numWarnings		+= 1;	break;
			default:									m_status.numFailed			+= 1;	break;
		}

		// terminateAfter, Resource error or any error in deinit means that execution should end
		if (terminateAfter || testResult == QP_TEST_RESULT_RESOURCE_ERROR)
			m_abortSession = true;
	}

	if (m_testCtx.getWatchDog())
		qpWatchDog_reset(m_testCtx.getWatchDog());
}